

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-utils.c
# Opt level: O2

void coda_str64(int64_t a,char *s)

{
  if (a < 0) {
    *s = '-';
    coda_str64u(-a,s + 1);
    return;
  }
  coda_str64u(a,s);
  return;
}

Assistant:

LIBCODA_API void coda_str64(int64_t a, char *s)
{
    if (a < 0)
    {
        s[0] = '-';
        /* shift by one to account for lowest negative value being one off compared to highest postive value */
        coda_str64u((uint64_t)(-(a + 1)) + 1, &s[1]);
    }
    else
    {
        coda_str64u((uint64_t)a, s);
    }
}